

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O3

PermutationMatrix<_1,__1,_int> * __thiscall
Eigen::PermutationMatrix<-1,_-1,_int>::operator=
          (PermutationMatrix<_1,__1,_int> *this,PermutationMatrix<_1,__1,_int> *other)

{
  ulong uVar1;
  int *piVar2;
  int *piVar3;
  undefined8 uVar4;
  Index size;
  Index index;
  ulong uVar5;
  long lVar6;
  
  PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::resizeLike<Eigen::Matrix<int,_1,1,0,_1,1>>
            ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)this,
             (EigenBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)other);
  uVar1 = (this->m_indices).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  if (uVar1 == (other->m_indices).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows) {
    uVar5 = uVar1 + 3;
    if (-1 < (long)uVar1) {
      uVar5 = uVar1;
    }
    uVar5 = uVar5 & 0xfffffffffffffffc;
    if (3 < (long)uVar1) {
      lVar6 = 0;
      do {
        piVar2 = (other->m_indices).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data + lVar6;
        uVar4 = *(undefined8 *)(piVar2 + 2);
        piVar3 = (this->m_indices).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data + lVar6;
        *(undefined8 *)piVar3 = *(undefined8 *)piVar2;
        *(undefined8 *)(piVar3 + 2) = uVar4;
        lVar6 = lVar6 + 4;
      } while (lVar6 < (long)uVar5);
    }
    if ((long)uVar5 < (long)uVar1) {
      piVar2 = (other->m_indices).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      piVar3 = (this->m_indices).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      do {
        piVar3[uVar5] = piVar2[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
    return this;
  }
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Assign.h"
                ,0x1f2,
                "Derived &Eigen::DenseBase<Eigen::Matrix<int, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<int, -1, 1>, OtherDerived = Eigen::Matrix<int, -1, 1>]"
               );
}

Assistant:

PermutationMatrix& operator=(const PermutationMatrix& other)
    {
      m_indices = other.m_indices;
      return *this;
    }